

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase312::run(TestCase312 *this)

{
  bool bVar1;
  int iVar2;
  int __flags;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int callCount;
  Own<kj::NetworkAddress> address;
  Own<kj::ConnectionReceiver> listener;
  Own<kj::AsyncIoStream> connection;
  Own<capnp::ClientHook> local_318;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Promise<void> listenPromise;
  AsyncIoContext ioContext;
  Client cap;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_270;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  TwoPartyServer server;
  TwoPartyClient client;
  Maybe<capnp::MessageSize> local_30;
  
  kj::setupAsyncIo();
  callCount = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&client,&callCount);
  Capability::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&local_318,(Own<capnp::_::TestInterfaceImpl> *)&client);
  TwoPartyServer::TwoPartyServer(&server,(Client *)&local_318);
  kj::Own<capnp::ClientHook>::dispose(&local_318);
  kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)&client);
  iVar2 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
            (&client,(undefined8 *)CONCAT44(extraout_var,iVar2),"127.0.0.1",10,0);
  kj::Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)&address,&client);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&client);
  (*(address.ptr)->_vptr_NetworkAddress[1])(&listener);
  TwoPartyServer::listen((TwoPartyServer *)&listenPromise,(int)&server,(int)listener.ptr);
  iVar2 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[3])();
  __flags = (*(listener.ptr)->_vptr_ConnectionReceiver[1])();
  __n = (char *)0xa;
  (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar2))
            (&response,(undefined8 *)CONCAT44(extraout_var_00,iVar2),"127.0.0.1");
  kj::Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)&client,&response);
  kj::Own<kj::NetworkAddress>::operator=(&address,(Own<kj::NetworkAddress> *)&client);
  kj::Own<kj::NetworkAddress>::dispose((Own<kj::NetworkAddress> *)&client);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&response);
  (**(address.ptr)->_vptr_NetworkAddress)(&client);
  kj::Promise<kj::Own<kj::AsyncIoStream>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)&connection,&client);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&client);
  TwoPartyClient::TwoPartyClient(&client,connection.ptr);
  TwoPartyClient::bootstrap((TwoPartyClient *)&response);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>(&cap,(Client *)&response);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&response);
  local_30.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest(&request,&cap,&local_30);
  *(undefined4 *)request.super_Builder._builder.data = 0x7b;
  *(byte *)((long)request.super_Builder._builder.data + 4) =
       *(byte *)((long)request.super_Builder._builder.data + 4) | 1;
  __buf = extraout_RDX;
  if ((callCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    response.super_Reader._reader.segment._0_4_ = 0;
    __n = "\"failed: expected \" \"(0) == (callCount)\", 0, callCount";
    __flags = 0x4c8271;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x14e,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response,&callCount);
    __buf = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_270,(int)&request,__buf,(size_t)__n,__flags);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response,&local_270);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_270);
  local_270.super_Builder._builder._0_16_ =
       capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX(&response.super_Reader);
  bVar1 = kj::operator==("foo",(StringPtr *)&local_270);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_270.super_Builder._builder._0_16_ =
         capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                   (&response.super_Reader);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x150,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (char (*) [4])0x4f93d8,(Reader *)&local_270);
  }
  if ((callCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_270.super_Builder._builder.segment._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x151,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)&local_270,&callCount);
  }
  kj::Own<capnp::ResponseHook>::dispose(&response.hook);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&cap.field_0x8);
  TwoPartyClient::~TwoPartyClient(&client);
  kj::Own<kj::AsyncIoStream>::dispose(&connection);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&listenPromise);
  kj::Own<kj::ConnectionReceiver>::dispose(&listener);
  kj::Own<kj::NetworkAddress>::dispose(&address);
  TwoPartyServer::~TwoPartyServer(&server);
  kj::AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(TwoPartyNetwork, ConvenienceClasses) {
  auto ioContext = kj::setupAsyncIo();

  int callCount = 0;
  TwoPartyServer server(kj::heap<TestInterfaceImpl>(callCount));

  auto address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1").wait(ioContext.waitScope);

  auto listener = address->listen();
  auto listenPromise = server.listen(*listener);

  address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1", listener->getPort()).wait(ioContext.waitScope);

  auto connection = address->connect().wait(ioContext.waitScope);
  TwoPartyClient client(*connection);
  auto cap = client.bootstrap().castAs<test::TestInterface>();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);
  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(ioContext.waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);
}